

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sliced_Wasserstein.h
# Opt level: O3

double __thiscall
Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance
          (Sliced_Wasserstein *this,Sliced_Wasserstein *second)

{
  undefined1 (*pauVar1) [16];
  double *pdVar2;
  double *pdVar3;
  undefined4 uVar4;
  pointer pvVar5;
  pointer pvVar6;
  void *pvVar7;
  void *pvVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  iterator iVar10;
  Sliced_Wasserstein *this_00;
  uint uVar11;
  int iVar12;
  pointer ppVar13;
  invalid_argument *this_01;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  size_type __n;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  int q;
  vector<double,_std::allocator<double>_> v2;
  int p;
  vector<int,_std::allocator<int>_> order1;
  double theta;
  Persistence_diagram diagram1;
  vector<int,_std::allocator<int>_> orderp2;
  vector<int,_std::allocator<int>_> orderp1;
  Persistence_diagram diagram2;
  vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  angles2;
  vector<int,_std::allocator<int>_> order2;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  anglePerm2;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  anglePerm1;
  default_random_engine re;
  vector<double,_std::allocator<double>_> v1;
  int local_153c;
  undefined1 local_1538 [16];
  void *local_1528;
  void *pvStack_1520;
  long local_1518;
  undefined1 local_1508 [16];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_14f8;
  vector<int,_std::allocator<int>_> local_14e0;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_14c8;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_14b0;
  undefined1 local_1498 [16];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1488;
  iterator iStack_1480;
  int *local_1478;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1468;
  iterator iStack_1460;
  int *local_1458;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_1450;
  void *local_1438;
  void *pvStack_1430;
  long local_1428;
  vector<int,_std::allocator<int>_> local_1418;
  Sliced_Wasserstein *local_1400;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  local_13f8;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  local_13e0;
  long local_13c8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13c0;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  local_1538._8_8_ = local_1538._0_8_;
  if (this->approx != second->approx) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,"Error: different approx values for representations");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&local_14b0,&this->diagram);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&local_1450,&second->diagram);
  iVar12 = this->approx;
  if (iVar12 != -1) {
    local_13b8.field_0._M_file = (void *)0x0;
    local_13b8.field_0._M_func = (_func_result_type_void_ptr *)0x0;
    local_13b8._16_8_ = 0;
    local_1518 = 0;
    local_1528 = (void *)0x0;
    pvStack_1520 = (void *)0x0;
    if (iVar12 < 1) {
      local_1538._0_8_ = 0.0;
    }
    else {
      local_1498._0_8_ = 3.141592653589793 / (double)iVar12;
      local_1538._0_8_ = 0.0;
      lVar16 = 0;
      do {
        if (local_13b8.field_0._M_func != (_func_result_type_void_ptr *)local_13b8.field_0._M_file)
        {
          local_13b8.field_0._M_func = (_func_result_type_void_ptr *)local_13b8.field_0._M_file;
        }
        if (pvStack_1520 != local_1528) {
          pvStack_1520 = local_1528;
        }
        pvVar5 = (this->projections).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar6 = (second->projections_diagonal).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::
        __merge<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pvVar5[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pvVar5[lVar16].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8),
                   pvVar6[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pvVar6[lVar16].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8),&local_13b8);
        pvVar5 = (second->projections).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar6 = (this->projections_diagonal).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::
        __merge<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pvVar5[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pvVar5[lVar16].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8),
                   pvVar6[lVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pvVar6[lVar16].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8),&local_1528);
        uVar11 = (uint)((ulong)((long)local_13b8.field_0._M_func - local_13b8._0_8_) >> 3);
        if ((int)uVar11 < 1) {
          dVar20 = 0.0;
        }
        else {
          dVar20 = 0.0;
          uVar17 = 0;
          do {
            dVar20 = dVar20 + ABS(*(double *)((long)local_13b8.field_0._M_file + uVar17 * 8) -
                                  *(double *)((long)local_1528 + uVar17 * 8));
            uVar17 = uVar17 + 1;
          } while ((uVar11 & 0x7fffffff) != uVar17);
        }
        local_1538._0_8_ = (double)local_1538._0_8_ + dVar20 * (double)local_1498._0_8_;
        lVar16 = lVar16 + 1;
      } while (lVar16 < this->approx);
      if (local_1528 != (void *)0x0) {
        operator_delete(local_1528,local_1518 - (long)local_1528);
      }
      if (local_13b8.field_0._M_file != (void *)0x0) {
        operator_delete(local_13b8.field_0._M_file,local_13b8._16_8_ - local_13b8._0_8_);
      }
    }
    goto LAB_00107969;
  }
  uVar17 = (long)local_14b0.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_14b0.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (uint)((ulong)((long)local_1450.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1450.
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  local_1498 = _DAT_0010b100;
  auVar23 = _DAT_0010b110;
  local_1400 = this;
  if (0 < (int)uVar11) {
    uVar18 = (ulong)(uVar11 & 0x7fffffff);
    lVar16 = 0;
    do {
      pauVar1 = (undefined1 (*) [16])
                ((long)&(local_1450.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar16);
      local_1538 = *pauVar1;
      local_13b8.field_0._M_file = (void *)((*(double *)(*pauVar1 + 8) + *(double *)*pauVar1) * 0.5)
      ;
      local_1528 = (void *)((*(double *)
                              ((long)&(local_1450.
                                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->first + lVar16) +
                            *(double *)
                             ((long)&(local_1450.
                                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->second + lVar16))
                           * 0.5);
      local_1508 = auVar23;
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<double,double>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_14b0,(double *)&local_13b8,(double *)&local_1528);
      auVar23 = maxpd(local_1538,local_1508);
      local_1498 = minpd(local_1538,local_1498);
      lVar16 = lVar16 + 0x10;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  uVar11 = (uint)(uVar17 >> 4);
  if (0 < (int)uVar11) {
    uVar17 = (ulong)(uVar11 & 0x7fffffff);
    lVar16 = 0;
    do {
      pauVar1 = (undefined1 (*) [16])
                ((long)&(local_14b0.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar16);
      local_13b8.field_0._M_file = (void *)((*(double *)(*pauVar1 + 8) + *(double *)*pauVar1) * 0.5)
      ;
      local_1528 = (void *)((*(double *)
                              ((long)&(local_14b0.
                                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->first + lVar16) +
                            *(double *)
                             ((long)&(local_14b0.
                                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->second + lVar16))
                           * 0.5);
      local_1538 = local_1498;
      local_1508 = auVar23;
      local_1498 = *pauVar1;
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<double,double>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_1450,(double *)&local_13b8,(double *)&local_1528);
      auVar23 = maxpd(local_1498,local_1508);
      local_1498 = minpd(local_1498,local_1538);
      lVar16 = lVar16 + 0x10;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  uVar17 = (long)local_14b0.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_14b0.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_1538 = auVar23;
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar11 = std::random_device::_M_getval();
  uVar17 = uVar17 >> 4;
  uVar14 = uVar11 / 0x7fffffff << 0x1f | uVar11 / 0x7fffffff;
  local_13c0._M_x = (unsigned_long)(uVar14 + uVar11 + (uint)(uVar11 + uVar14 == 0));
  local_1508._0_8_ = uVar17;
  if ((int)(uint)uVar17 < 1) {
    local_1528 = (void *)0x0;
    pvStack_1520 = (void *)0x0;
    local_1518 = 0;
    local_1428 = 0;
    local_1438 = (void *)0x0;
    pvStack_1430 = (void *)0x0;
  }
  else {
    local_1538._8_8_ = ((double)local_1538._8_8_ - (double)local_1498._8_8_) * 0.0001;
    local_1538._0_8_ = ((double)local_1538._0_8_ - (double)local_1498._0_8_) * 0.0001;
    uVar17 = (ulong)((uint)uVar17 & 0x7fffffff);
    lVar16 = 0;
    do {
      dVar20 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (&local_13c0);
      this_00 = local_1400;
      dVar21 = dVar20 + dVar20 + -1.0;
      pdVar2 = (double *)
               ((long)&(local_14b0.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar16);
      dVar20 = pdVar2[1];
      dVar22 = dVar21 * (double)local_1538._0_8_;
      dVar21 = dVar21 * (double)local_1538._8_8_;
      pdVar3 = (double *)
               ((long)&(local_14b0.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar16);
      *pdVar3 = *pdVar2 + dVar22;
      pdVar3[1] = dVar20 + dVar21;
      pdVar2 = (double *)
               ((long)&(local_1450.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar16);
      dVar20 = pdVar2[1];
      pdVar3 = (double *)
               ((long)&(local_1450.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar16);
      *pdVar3 = *pdVar2 + dVar22;
      pdVar3[1] = dVar20 + dVar21;
      lVar16 = lVar16 + 0x10;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
    local_1528 = (void *)0x0;
    pvStack_1520 = (void *)0x0;
    local_1518 = 0;
    local_1428 = 0;
    local_1438 = (void *)0x0;
    pvStack_1430 = (void *)0x0;
    uVar17 = local_1508._0_8_;
    if (0 < local_1508._0_4_) {
      iVar12 = 0;
      do {
        iVar15 = iVar12 + 1;
        local_1538._0_4_ = iVar15;
        if (iVar15 < (int)local_1508._0_8_) {
          do {
            local_1468._M_current = (int *)compute_angle(this_00,&local_14b0,iVar12,iVar15);
            local_1488._M_current = (int *)compute_angle(this_00,&local_1450,iVar12,iVar15);
            local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._0_4_ = iVar12;
            local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._4_4_ = iVar15;
            std::
            vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
            ::emplace_back<double&,std::pair<int,int>>
                      ((vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
                        *)&local_1528,(double *)&local_1468,(pair<int,_int> *)&local_14e0);
            local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._0_4_ = iVar12;
            local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._4_4_ = iVar15;
            std::
            vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
            ::emplace_back<double&,std::pair<int,int>>
                      ((vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
                        *)&local_1438,(double *)&local_1488,(pair<int,_int> *)&local_14e0);
            iVar15 = iVar15 + 1;
          } while (local_1508._0_4_ != iVar15);
        }
        pvVar8 = pvStack_1520;
        pvVar7 = local_1528;
        uVar17 = local_1508._0_8_;
        iVar12 = local_1538._0_4_;
      } while (local_1538._0_4_ != local_1508._0_4_);
      if (local_1528 != pvStack_1520) {
        uVar18 = (long)pvStack_1520 - (long)local_1528 >> 4;
        lVar16 = 0x3f;
        if (uVar18 != 0) {
          for (; uVar18 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_1_>>
                  (local_1528,pvStack_1520,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_1_>>
                  (pvVar7,pvVar8);
      }
    }
  }
  pvVar8 = pvStack_1430;
  pvVar7 = local_1438;
  uVar11 = (uint)uVar17;
  if (local_1438 != pvStack_1430) {
    uVar17 = (long)pvStack_1430 - (long)local_1438 >> 4;
    lVar16 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_2_>>
              (local_1438,pvStack_1430,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_2_>>
              (pvVar7,pvVar8);
  }
  local_1468._M_current = (int *)0x0;
  iStack_1460._M_current = (int *)0x0;
  local_1458 = (int *)0x0;
  local_1478 = (int *)0x0;
  local_1488._M_current = (int *)0x0;
  iStack_1480._M_current = (int *)0x0;
  local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  if (0 < (int)uVar11) {
    do {
      if (iStack_1460._M_current == local_1458) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1468,iStack_1460,(int *)&local_14e0);
      }
      else {
        *iStack_1460._M_current =
             (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iStack_1460._M_current = iStack_1460._M_current + 1;
      }
      if (iStack_1480._M_current == local_1478) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1488,iStack_1480,(int *)&local_14e0);
      }
      else {
        *iStack_1480._M_current =
             (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iStack_1480._M_current = iStack_1480._M_current + 1;
      }
      iVar10._M_current = iStack_1460._M_current;
      _Var9._M_current = local_1468._M_current;
      local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ =
           (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      uVar11 = local_1508._0_4_;
    } while ((int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start < (int)local_1508._0_4_);
    if (local_1468._M_current != iStack_1460._M_current) {
      uVar17 = (long)iStack_1460._M_current - (long)local_1468._M_current >> 2;
      lVar16 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_1_>>
                (local_1468,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 iStack_1460._M_current,(ulong)(((uint)lVar16 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:234:49)>
                  )&local_14b0);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_1_>>
                (_Var9,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       iVar10._M_current,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:234:49)>
                  )&local_14b0);
    }
  }
  iVar10._M_current = iStack_1480._M_current;
  _Var9._M_current = local_1488._M_current;
  if (local_1488._M_current != iStack_1480._M_current) {
    uVar17 = (long)iStack_1480._M_current - (long)local_1488._M_current >> 2;
    lVar16 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_2_>>
              (local_1488,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               iStack_1480._M_current,(ulong)(((uint)lVar16 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:240:49)>
                )&local_1450);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_2_>>
              (_Var9,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     iVar10._M_current,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:240:49)>
                )&local_1450);
  }
  __n = (size_type)(int)uVar11;
  std::vector<int,_std::allocator<int>_>::vector(&local_14e0,__n,(allocator_type *)&local_1418);
  std::vector<int,_std::allocator<int>_>::vector(&local_1418,__n,(allocator_type *)&local_13e0);
  if (0 < (int)uVar11) {
    uVar17 = 0;
    do {
      *(int *)(CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) +
              (long)local_1468._M_current[uVar17] * 4) = (int)uVar17;
      local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_1488._M_current[uVar17]] = (int)uVar17;
      uVar17 = uVar17 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar17);
  }
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::vector(&local_13e0,__n,(allocator_type *)&local_13f8);
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::vector(&local_13f8,__n,(allocator_type *)&local_14c8);
  uVar11 = (uint)((ulong)((long)pvStack_1520 - (long)local_1528) >> 4);
  if (0 < (int)uVar11) {
    uVar17 = (ulong)(uVar11 & 0x7fffffff);
    lVar19 = 0xc;
    lVar16 = CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
    do {
      local_14c8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)((long)local_1528 + lVar19 + -0xc);
      iVar12 = *(int *)((long)local_1528 + lVar19 + -4);
      local_14f8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_14f8.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar12);
      local_153c = *(int *)((long)local_1528 + lVar19);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (local_13e0.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + *(int *)(lVar16 + (long)iVar12 * 4)),
                 (int *)&local_14f8,(double *)&local_14c8);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (local_13e0.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)(CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) +
                         (long)local_153c * 4)),&local_153c,(double *)&local_14c8);
      lVar16 = CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
      uVar4 = *(undefined4 *)
               (lVar16 + (long)(int)local_14f8.
                                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start * 4);
      *(undefined4 *)
       (lVar16 + (long)(int)local_14f8.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start * 4) =
           *(undefined4 *)(lVar16 + (long)local_153c * 4);
      *(undefined4 *)(lVar16 + (long)local_153c * 4) = uVar4;
      lVar19 = lVar19 + 0x10;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  uVar11 = (uint)((ulong)((long)pvStack_1430 - (long)local_1438) >> 4);
  if (0 < (int)uVar11) {
    uVar17 = (ulong)(uVar11 & 0x7fffffff);
    lVar16 = 0xc;
    do {
      local_14c8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)((long)local_1438 + lVar16 + -0xc);
      iVar12 = *(int *)((long)local_1438 + lVar16 + -4);
      local_14f8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_14f8.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar12);
      local_153c = *(int *)((long)local_1438 + lVar16);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (local_13f8.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar12]),(int *)&local_14f8,(double *)&local_14c8)
      ;
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (local_13f8.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_153c]),&local_153c,(double *)&local_14c8);
      iVar12 = local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)local_14f8.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start];
      local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)local_14f8.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start] =
           local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[local_153c];
      local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_153c] = iVar12;
      lVar16 = lVar16 + 0x10;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  local_14f8.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_14f8.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  if ((int)local_1508._0_4_ < 1) {
LAB_00107896:
    local_1538._0_8_ = 0.0;
  }
  else {
    iVar12 = 0;
    do {
      local_14c8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x3ff921fb54442d18;
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (local_13e0.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)(CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) + (long)iVar12 * 4
                         )),(int *)&local_14f8,(double *)&local_14c8);
      local_14c8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x3ff921fb54442d18;
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (local_13f8.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(int)local_14f8.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start]),(int *)&local_14f8,
                 (double *)&local_14c8);
      auVar23 = local_1508;
      iVar12 = (int)local_14f8.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      local_14f8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_14f8.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar12);
    } while (iVar12 < (int)local_1508._0_4_);
    if ((int)local_1508._0_4_ < 1) goto LAB_00107896;
    local_1508._4_4_ = 0;
    local_1508._0_4_ = local_1508._0_4_ & 0x7fffffff;
    local_1538._0_8_ = 0.0;
    lVar16 = 0;
    local_1508._8_8_ = auVar23._8_8_;
    do {
      local_14c8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_14c8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_14c8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_14f8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_14f8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_14f8.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_13c8 = lVar16;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&local_14c8,
                 local_13e0.
                 super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar16);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&local_14f8,
                 local_13f8.
                 super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar16);
      dVar20 = (local_14f8.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second;
      if ((local_14c8.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->second <=
          (local_14f8.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->second) {
        dVar20 = (local_14c8.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second;
      }
      uVar17 = 0;
      dVar21 = -1.5707963267948966;
      uVar18 = 0;
      ppVar13 = local_14c8.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar12 = ppVar13[uVar18].first;
        iVar15 = local_14f8.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17].first;
        if ((local_14b0.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar12].first !=
             local_1450.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar15].first) ||
           (NAN(local_14b0.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar12].first) ||
            NAN(local_1450.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar15].first))) {
LAB_00107784:
          if ((dVar21 != dVar20) || (NAN(dVar21) || NAN(dVar20))) {
            local_1498._0_8_ = dVar20;
            dVar20 = compute_int(local_1400,dVar21,dVar20,iVar12,iVar15,&local_14b0,&local_1450);
            local_1538._0_8_ = (double)local_1538._0_8_ + dVar20;
            ppVar13 = local_14c8.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar20 = (double)local_1498._0_8_;
          }
        }
        else if ((local_14b0.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar12].second !=
                  local_1450.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar15].second) ||
                (NAN(local_14b0.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar12].second) ||
                 NAN(local_1450.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar15].second))) goto LAB_00107784;
        dVar21 = dVar20;
        if ((dVar21 == ppVar13[uVar18].second) && (!NAN(dVar21) && !NAN(ppVar13[uVar18].second))) {
          uVar18 = (ulong)((int)uVar18 +
                          (uint)(uVar18 < ((long)local_14c8.
                                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)ppVar13 >> 4) - 1U));
        }
        dVar20 = local_14f8.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar17].second;
        if ((dVar21 == dVar20) && (!NAN(dVar21) && !NAN(dVar20))) {
          uVar17 = (ulong)((int)uVar17 +
                          (uint)(uVar17 < ((long)local_14f8.
                                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_14f8.
                                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 4) -
                                          1U));
          dVar20 = local_14f8.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar17].second;
        }
        if (ppVar13[uVar18].second <= dVar20) {
          dVar20 = ppVar13[uVar18].second;
        }
      } while ((dVar21 != 1.5707963267948966) || (NAN(dVar21)));
      operator_delete(local_14f8.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_14f8.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_14f8.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      if (local_14c8.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_14c8.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_14c8.
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_14c8.
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar16 = local_13c8 + 1;
    } while (lVar16 != local_1508._0_8_);
  }
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::~vector(&local_13f8);
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::~vector(&local_13e0);
  if (local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar7 = (void *)CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,(long)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar7);
  }
  if (local_1488._M_current != (int *)0x0) {
    operator_delete(local_1488._M_current,(long)local_1478 - (long)local_1488._M_current);
  }
  if (local_1468._M_current != (int *)0x0) {
    operator_delete(local_1468._M_current,(long)local_1458 - (long)local_1468._M_current);
  }
  if (local_1438 != (void *)0x0) {
    operator_delete(local_1438,local_1428 - (long)local_1438);
  }
  if (local_1528 != (void *)0x0) {
    operator_delete(local_1528,local_1518 - (long)local_1528);
  }
  std::random_device::_M_fini();
LAB_00107969:
  if (local_1450.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1450.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1450.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1450.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_14b0.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_14b0.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_14b0.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_14b0.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (double)local_1538._0_8_ / 3.141592653589793;
}

Assistant:

double compute_sliced_wasserstein_distance(const Sliced_Wasserstein& second) const {
    GUDHI_CHECK(this->approx == second.approx,
                std::invalid_argument("Error: different approx values for representations"));

    Persistence_diagram diagram1 = this->diagram;
    Persistence_diagram diagram2 = second.diagram;
    double sw = 0;

    if (this->approx == -1) {
      // Add projections onto diagonal.
      int n1, n2;
      n1 = diagram1.size();
      n2 = diagram2.size();
      double min_ordinate = std::numeric_limits<double>::max();
      double min_abscissa = std::numeric_limits<double>::max();
      double max_ordinate = std::numeric_limits<double>::lowest();
      double max_abscissa = std::numeric_limits<double>::lowest();
      for (int i = 0; i < n2; i++) {
        min_ordinate = std::min(min_ordinate, diagram2[i].second);
        min_abscissa = std::min(min_abscissa, diagram2[i].first);
        max_ordinate = std::max(max_ordinate, diagram2[i].second);
        max_abscissa = std::max(max_abscissa, diagram2[i].first);
        diagram1.emplace_back((diagram2[i].first + diagram2[i].second) / 2,
                              (diagram2[i].first + diagram2[i].second) / 2);
      }
      for (int i = 0; i < n1; i++) {
        min_ordinate = std::min(min_ordinate, diagram1[i].second);
        min_abscissa = std::min(min_abscissa, diagram1[i].first);
        max_ordinate = std::max(max_ordinate, diagram1[i].second);
        max_abscissa = std::max(max_abscissa, diagram1[i].first);
        diagram2.emplace_back((diagram1[i].first + diagram1[i].second) / 2,
                              (diagram1[i].first + diagram1[i].second) / 2);
      }
      int num_pts_dgm = diagram1.size();

      // Slightly perturb the points so that the PDs are in generic positions.
      double epsilon = 0.0001;
      double thresh_y = (max_ordinate - min_ordinate) * epsilon;
      double thresh_x = (max_abscissa - min_abscissa) * epsilon;
      std::random_device rd;
      std::default_random_engine re(rd());
      std::uniform_real_distribution<double> uni(-1, 1);
      for (int i = 0; i < num_pts_dgm; i++) {
        double u = uni(re);
        diagram1[i].first += u * thresh_x;
        diagram1[i].second += u * thresh_y;
        diagram2[i].first += u * thresh_x;
        diagram2[i].second += u * thresh_y;
      }

      // Compute all angles in both PDs.
      std::vector<std::pair<double, std::pair<int, int> > > angles1, angles2;
      for (int i = 0; i < num_pts_dgm; i++) {
        for (int j = i + 1; j < num_pts_dgm; j++) {
          double theta1 = compute_angle(diagram1, i, j);
          double theta2 = compute_angle(diagram2, i, j);
          angles1.emplace_back(theta1, std::pair<int, int>(i, j));
          angles2.emplace_back(theta2, std::pair<int, int>(i, j));
        }
      }

      // Sort angles.
      std::sort(angles1.begin(), angles1.end(),
                [](const std::pair<double, std::pair<int, int> >& p1,
                   const std::pair<double, std::pair<int, int> >& p2) { return (p1.first < p2.first); });
      std::sort(angles2.begin(), angles2.end(),
                [](const std::pair<double, std::pair<int, int> >& p1,
                   const std::pair<double, std::pair<int, int> >& p2) { return (p1.first < p2.first); });

      // Initialize orders of the points of both PDs (given by ordinates when theta = -pi/2).
      std::vector<int> orderp1, orderp2;
      for (int i = 0; i < num_pts_dgm; i++) {
        orderp1.push_back(i);
        orderp2.push_back(i);
      }
      std::sort(orderp1.begin(), orderp1.end(), [&](int i, int j) {
        if (diagram1[i].second != diagram1[j].second)
          return (diagram1[i].second < diagram1[j].second);
        else
          return (diagram1[i].first > diagram1[j].first);
      });
      std::sort(orderp2.begin(), orderp2.end(), [&](int i, int j) {
        if (diagram2[i].second != diagram2[j].second)
          return (diagram2[i].second < diagram2[j].second);
        else
          return (diagram2[i].first > diagram2[j].first);
      });

      // Find the inverses of the orders.
      std::vector<int> order1(num_pts_dgm);
      std::vector<int> order2(num_pts_dgm);
      for (int i = 0; i < num_pts_dgm; i++) {
        order1[orderp1[i]] = i;
        order2[orderp2[i]] = i;
      }

      // Record all inversions of points in the orders as theta varies along the positive half-disk.
      std::vector<std::vector<std::pair<int, double> > > anglePerm1(num_pts_dgm);
      std::vector<std::vector<std::pair<int, double> > > anglePerm2(num_pts_dgm);

      int m1 = angles1.size();
      for (int i = 0; i < m1; i++) {
        double theta = angles1[i].first;
        int p = angles1[i].second.first;
        int q = angles1[i].second.second;
        anglePerm1[order1[p]].emplace_back(p, theta);
        anglePerm1[order1[q]].emplace_back(q, theta);
        int a = order1[p];
        int b = order1[q];
        order1[p] = b;
        order1[q] = a;
      }

      int m2 = angles2.size();
      for (int i = 0; i < m2; i++) {
        double theta = angles2[i].first;
        int p = angles2[i].second.first;
        int q = angles2[i].second.second;
        anglePerm2[order2[p]].emplace_back(p, theta);
        anglePerm2[order2[q]].emplace_back(q, theta);
        int a = order2[p];
        int b = order2[q];
        order2[p] = b;
        order2[q] = a;
      }

      for (int i = 0; i < num_pts_dgm; i++) {
        anglePerm1[order1[i]].emplace_back(i, pi / 2);
        anglePerm2[order2[i]].emplace_back(i, pi / 2);
      }

      // Compute the SW distance with the list of inversions.
      for (int i = 0; i < num_pts_dgm; i++) {
        std::vector<std::pair<int, double> > u, v;
        u = anglePerm1[i];
        v = anglePerm2[i];
        double theta1, theta2;
        theta1 = -pi / 2;
        unsigned int ku, kv;
        ku = 0;
        kv = 0;
        theta2 = std::min(u[ku].second, v[kv].second);
        while (theta1 != pi / 2) {
          if (diagram1[u[ku].first].first != diagram2[v[kv].first].first ||
              diagram1[u[ku].first].second != diagram2[v[kv].first].second)
            if (theta1 != theta2) sw += compute_int(theta1, theta2, u[ku].first, v[kv].first, diagram1, diagram2);
          theta1 = theta2;
          if ((theta2 == u[ku].second) && ku < u.size() - 1) ku++;
          if ((theta2 == v[kv].second) && kv < v.size() - 1) kv++;
          theta2 = std::min(u[ku].second, v[kv].second);
        }
      }
    } else {
      double step = pi / this->approx;
      std::vector<double> v1, v2;
      for (int i = 0; i < this->approx; i++) {
        v1.clear();
        v2.clear();
        std::merge(this->projections[i].begin(), this->projections[i].end(), second.projections_diagonal[i].begin(),
                   second.projections_diagonal[i].end(), std::back_inserter(v1));
        std::merge(second.projections[i].begin(), second.projections[i].end(), this->projections_diagonal[i].begin(),
                   this->projections_diagonal[i].end(), std::back_inserter(v2));

        int n = v1.size();
        double f = 0;
        for (int j = 0; j < n; j++) f += std::abs(v1[j] - v2[j]);
        sw += f * step;
      }
    }

    return sw / pi;
  }